

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

GF2E dot_product(vector<field::GF2E,_std::allocator<field::GF2E>_> *lhs,
                vector<field::GF2E,_std::allocator<field::GF2E>_> *rhs)

{
  longlong __args [2];
  ulong uVar1;
  function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
  *pfVar2;
  size_type sVar3;
  size_type sVar4;
  runtime_error *this;
  const_reference pvVar5;
  unsigned_long data;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qb;
  size_t i;
  __m128i accum;
  GF2E result;
  uint64_t in_stack_ffffffffffffff50;
  ulong in_stack_ffffffffffffff58;
  function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
  *in_stack_ffffffffffffff60;
  ulong local_80;
  ulong local_78;
  function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
  *pfStack_70;
  GF2E local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_18;
  function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
  *pfStack_10;
  
  sVar3 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RDI);
  sVar4 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI);
  if (sVar3 != sVar4) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"adding vectors of different sizes");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = 0;
  uStack_30 = 0;
  local_78 = 0;
  pfStack_70 = (function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
                *)0x0;
  local_80 = 0;
  uVar1 = local_78;
  pfVar2 = pfStack_70;
  while( true ) {
    pfStack_70 = pfVar2;
    local_78 = uVar1;
    sVar3 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RDI);
    if (sVar3 <= local_80) break;
    pvVar5 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDI,local_80);
    in_stack_ffffffffffffff50 = pvVar5->data;
    pvVar5 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RSI,local_80);
    anon_unknown.dwarf_49b37::clmul(in_stack_ffffffffffffff50,pvVar5->data);
    local_80 = local_80 + 1;
    in_stack_ffffffffffffff58 = local_78;
    in_stack_ffffffffffffff60 = pfStack_70;
    uVar1 = local_78 ^ extraout_XMM0_Qa;
    pfVar2 = (function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
              *)((ulong)pfStack_70 ^ extraout_XMM0_Qb);
    local_18 = local_78;
    pfStack_10 = pfStack_70;
  }
  __args[1] = in_stack_ffffffffffffff58;
  __args[0] = in_stack_ffffffffffffff50;
  data = std::
         function<unsigned_long_(__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long)>
         ::operator()(in_stack_ffffffffffffff60,__args);
  field::GF2E::GF2E(&local_40,data);
  return (GF2E)local_40.data;
}

Assistant:

field::GF2E dot_product(const std::vector<field::GF2E> &lhs,
                        const std::vector<field::GF2E> &rhs) {

  if (lhs.size() != rhs.size())
    throw std::runtime_error("adding vectors of different sizes");

  // field::GF2E result;
  // for (size_t i = 0; i < lhs.size(); i++)
  // result += lhs[i] * rhs[i];
  __m128i accum = _mm_setzero_si128();
  for (size_t i = 0; i < lhs.size(); i++)
    accum = _mm_xor_si128(accum, clmul(lhs[i].data, rhs[i].data));

  field::GF2E result(field::GF2E::reduce(accum));
  return result;
}